

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::successOrFailColoredStringToStream
          (ConsoleReporter *this,bool success,Enum at,char *success_str)

{
  Enum code;
  ostream *poVar1;
  char *pcVar2;
  char *success_str_local;
  Enum at_local;
  bool success_local;
  ConsoleReporter *this_local;
  
  poVar1 = this->s;
  code = getSuccessOrFailColor(this,success,at);
  poVar1 = Color::operator<<(poVar1,code);
  pcVar2 = getSuccessOrFailString(this,success,at,success_str);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

void successOrFailColoredStringToStream(bool success, assertType::Enum at,
                                                const char* success_str = "SUCCESS") {
            s << getSuccessOrFailColor(success, at)
              << getSuccessOrFailString(success, at, success_str) << ": ";
        }